

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::Clear(CharSet<char16_t> *this,ArenaAllocator *allocator)

{
  CharSetNode *pCVar1;
  bool bVar2;
  uint local_1c;
  int i;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  bVar2 = IsCompact(this);
  if ((!bVar2) && ((this->rep).compact.countPlusOne != 0)) {
    pCVar1 = (this->rep).full.root;
    (**pCVar1->_vptr_CharSetNode)(pCVar1,allocator);
  }
  (this->rep).compact.countPlusOne = 1;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    *(undefined4 *)((long)&this->rep + (long)(int)local_1c * 4 + 8) = 0xffffffff;
  }
  return;
}

Assistant:

void CharSet<char16>::Clear(ArenaAllocator* allocator)
    {
        if (!IsCompact() && rep.full.root != nullptr)
            rep.full.root->FreeSelf(allocator);
        rep.compact.countPlusOne = 1;
        for (int i = 0; i < MaxCompact; i++)
            rep.compact.cs[i] = emptySlot;
    }